

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void nn_hash_init(nn_hash *self)

{
  nn_list *pnVar1;
  uint local_14;
  uint32_t i;
  nn_hash *self_local;
  
  self->slots = 0x20;
  self->items = 0;
  pnVar1 = (nn_list *)nn_alloc_(0x200);
  self->array = pnVar1;
  if (self->array == (nn_list *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/utils/hash.c"
            ,0x29);
    fflush(_stderr);
    nn_err_abort();
  }
  for (local_14 = 0; local_14 != 0x20; local_14 = local_14 + 1) {
    nn_list_init(self->array + local_14);
  }
  return;
}

Assistant:

void nn_hash_init (struct nn_hash *self)
{
    uint32_t i;

    self->slots = NN_HASH_INITIAL_SLOTS;
    self->items = 0;
    self->array = nn_alloc (sizeof (struct nn_list) * NN_HASH_INITIAL_SLOTS,
        "hash map");
    alloc_assert (self->array);
    for (i = 0; i != NN_HASH_INITIAL_SLOTS; ++i)
        nn_list_init (&self->array [i]);
}